

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O2

void usage(void)

{
  puts("Usage: iconify [-h] [-f [-a] [-n]]");
  puts("Options:");
  puts("  -a create windows for all monitors");
  puts("  -f create full screen window(s)");
  puts("  -h show this help");
  puts("  -n no automatic iconification of full screen windows");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: iconify [-h] [-f [-a] [-n]]\n");
    printf("Options:\n");
    printf("  -a create windows for all monitors\n");
    printf("  -f create full screen window(s)\n");
    printf("  -h show this help\n");
    printf("  -n no automatic iconification of full screen windows\n");
}